

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkroom.c
# Opt level: O1

void mkroom(level *lev,int roomtype)

{
  char cVar1;
  bool bVar2;
  byte bVar3;
  mkroom *pmVar4;
  int *piVar5;
  int iVar6;
  uint uVar7;
  char *__s2;
  int *piVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  char *__s1;
  shclass *psVar14;
  int iVar15;
  mkroom *croom;
  
  if (roomtype < 0x12) {
    switch(roomtype) {
    case 2:
      iVar15 = 2;
      break;
    case 3:
      mkswamp(lev);
      return;
    default:
      impossible("Tried to make a room of type %d.");
      return;
    case 5:
      iVar15 = 5;
      break;
    case 6:
      iVar15 = 6;
      break;
    case 7:
      iVar15 = 7;
      break;
    case 8:
      iVar15 = 8;
      break;
    case 10:
      mktemple(lev);
      return;
    case 0xb:
      iVar15 = 0xb;
      break;
    case 0xc:
      iVar15 = 0xc;
      break;
    case 0xd:
      iVar15 = 0xd;
      break;
    case 0xe:
      mkgarden(lev,(mkroom *)0x0);
      return;
    case 0xf:
      iVar15 = 0xf;
      break;
    case 0x10:
      iVar15 = 0x10;
      break;
    case 0x11:
      mkpoolroom(lev);
      return;
    }
    mkzoo(lev,iVar15);
    return;
  }
  iVar15 = -1;
  if ((flags.debug == '\0') || (__s2 = nh_getenv("SHOPTYPE"), __s2 == (char *)0x0)) {
    bVar3 = 0;
    goto LAB_001e1c5d;
  }
  __s1 = "general store";
  psVar14 = shtypes;
  iVar15 = 0;
  do {
    psVar14 = psVar14 + 1;
    iVar6 = strcmp(__s1,__s2);
    iVar9 = 5;
    if ((iVar6 == 0) || (*__s2 == ""[psVar14[-1].symb])) goto LAB_001e1fb8;
    __s1 = psVar14->name;
    iVar15 = iVar15 + 1;
  } while (__s1 != (char *)0x0);
  iVar9 = 0;
  iVar15 = 0;
  switch(*__s2) {
  case 'A':
  case 'a':
    iVar15 = 0xd;
    break;
  case 'B':
  case 'b':
    iVar15 = 5;
    break;
  case 'C':
  case 'c':
    iVar15 = 0xc;
    break;
  default:
    goto switchD_001e1c23_caseD_44;
  case 'G':
  case 'g':
    iVar15 = 0;
    goto LAB_001e1fb8;
  case 'L':
  case 'l':
    iVar15 = 0xb;
    break;
  case 'M':
  case 'm':
    iVar15 = 6;
    break;
  case 'O':
  case 'o':
    mkpoolroom(lev);
    goto LAB_001e1fad;
  case 'P':
  case 'p':
    iVar15 = 0x10;
    break;
  case 'R':
  case 'r':
    iVar15 = 0xf;
    break;
  case 'S':
  case 's':
    iVar15 = 7;
    break;
  case 'T':
  case 't':
    iVar15 = 2;
    break;
  case 'Z':
  case 'z':
    iVar15 = 8;
    break;
  case '_':
    mktemple(lev);
    goto LAB_001e1fad;
  case 'n':
    mkgarden(lev,(mkroom *)0x0);
    goto LAB_001e1fad;
  case '}':
    mkswamp(lev);
    goto LAB_001e1fad;
  }
  mkzoo(lev,iVar15);
LAB_001e1fad:
  iVar15 = 1;
switchD_001e1c23_caseD_44:
  iVar9 = iVar15;
  iVar15 = -1;
LAB_001e1fb8:
  bVar3 = 1;
  if ((iVar9 == 5) || (iVar9 == 0)) {
LAB_001e1c5d:
    if (-1 < lev->rooms[0].hx) {
      croom = lev->rooms;
      lVar11 = 0;
      do {
        if ((long)lev->nroom <= (lVar11 >> 3) * -0x7b425ed097b425ed) {
          pline("lev->rooms not closed by -1?");
          return;
        }
        if ((((((croom->rtype == '\0') && (croom != lev->dnstairs_room)) &&
              ((cVar1 = (lev->sstairs).sx, cVar1 == '\0' ||
               (((lev->sstairs).up != '\0' || (croom != lev->sstairs_room)))))) &&
             (croom != lev->upstairs_room)) &&
            (((cVar1 == '\0' || ((lev->sstairs).up == '\0')) || (croom != lev->sstairs_room)))) &&
           ((((bool)(bVar3 & flags.debug != '\0') && (croom->doorct != '\0')) ||
            (croom->doorct == '\x01')))) {
          if (croom->rlit == '\0') {
            iVar6 = (int)croom->lx;
            if (iVar6 + -1 <= croom->hx + 1) {
              lVar10 = (long)lev + (long)iVar6 * 0xfc + -0xc2;
              lVar11 = (long)iVar6 + -1;
              do {
                iVar6 = (int)croom->ly;
                if (iVar6 + -1 <= croom->hy + 1) {
                  lVar12 = (long)iVar6 + -2;
                  lVar13 = lVar10 + (long)iVar6 * 0xc;
                  do {
                    *(byte *)(lVar13 + 1) = *(byte *)(lVar13 + 1) | 4;
                    lVar12 = lVar12 + 1;
                    lVar13 = lVar13 + 0xc;
                  } while (lVar12 <= croom->hy);
                }
                lVar10 = lVar10 + 0xfc;
                bVar2 = lVar11 <= croom->hx;
                lVar11 = lVar11 + 1;
              } while (bVar2);
            }
            croom->rlit = '\x01';
          }
          if (iVar15 < 0) {
            uVar7 = mt_random();
            iVar15 = -1;
            piVar5 = &shtypes[0].prob;
            iVar6 = uVar7 % 100 + 1;
            do {
              piVar8 = piVar5;
              iVar15 = iVar15 + 1;
              iVar9 = iVar6 - *piVar8;
              bVar2 = *piVar8 <= iVar6;
              piVar5 = piVar8 + 0x30;
              iVar6 = iVar9;
            } while (iVar9 != 0 && bVar2);
            if ((0x14 < (((int)croom->hy - (int)croom->ly) + 1) *
                        (((int)croom->hx - (int)croom->lx) + 1)) &&
               ((*(byte *)(piVar8 + -1) & 0xfe) == 10)) {
              iVar15 = 0;
            }
          }
          croom->rtype = (char)iVar15 + '\x12';
          topologize(lev,croom);
          stock_room(iVar15,lev,croom);
          return;
        }
        lVar11 = lVar11 + 0xd8;
        pmVar4 = croom + 1;
        croom = croom + 1;
      } while (-1 < pmVar4->hx);
    }
  }
  return;
}

Assistant:

void mkroom(struct level *lev, int roomtype)
{
    if (roomtype >= SHOPBASE)
	mkshop(lev);	/* someday, we should be able to specify shop type */
    else switch(roomtype) {
	case COURT:	mkzoo(lev, COURT); break;
	case ZOO:	mkzoo(lev, ZOO); break;
	case BEEHIVE:	mkzoo(lev, BEEHIVE); break;
	case MORGUE:	mkzoo(lev, MORGUE); break;
	case BARRACKS:	mkzoo(lev, BARRACKS); break;
	case SWAMP:	mkswamp(lev); break;
	case GARDEN:	mkgarden(lev, NULL); break;
	case TEMPLE:	mktemple(lev); break;
	case LEPREHALL:	mkzoo(lev, LEPREHALL); break;
	case COCKNEST:	mkzoo(lev, COCKNEST); break;
	case ARMORY:	mkzoo(lev, ARMORY); break;
	case ANTHOLE:	mkzoo(lev, ANTHOLE); break;
	case LEMUREPIT:	mkzoo(lev, LEMUREPIT); break;
	case POOLROOM:	mkpoolroom(lev); break;
	default:	impossible("Tried to make a room of type %d.", roomtype);
    }
}